

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugLogV(char *fmt,__va_list_tag *args)

{
  int new_size;
  char *pcVar1;
  ImGuiTextIndex *in_RSI;
  __va_list_tag *unaff_retaddr;
  char *in_stack_00000008;
  ImGuiTextBuffer *in_stack_00000010;
  int old_size;
  ImGuiContext *g;
  ImGuiTextIndex *this;
  int old_size_00;
  ImGuiContext *base;
  
  base = GImGui;
  new_size = ImGuiTextBuffer::size(&GImGui->DebugLogBuf);
  if (base->ContextName[0] == '\0') {
    ImGuiTextBuffer::appendf(&base->DebugLogBuf,"[%05d] ",(ulong)(uint)base->FrameCount);
  }
  else {
    ImGuiTextBuffer::appendf
              (&base->DebugLogBuf,"[%s] [%05d] ",base->ContextName,(ulong)(uint)base->FrameCount);
  }
  ImGuiTextBuffer::appendfv(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  this = &base->DebugLogIndex;
  ImGuiTextBuffer::c_str(&base->DebugLogBuf);
  old_size_00 = new_size;
  ImGuiTextBuffer::size(&base->DebugLogBuf);
  ImGuiTextIndex::append(in_RSI,&base->Initialized,old_size_00,new_size);
  if ((base->DebugLogFlags & 0x100000U) != 0) {
    pcVar1 = ImGuiTextBuffer::begin((ImGuiTextBuffer *)this);
    printf("%s",pcVar1 + old_size_00);
  }
  return;
}

Assistant:

void ImGui::DebugLogV(const char* fmt, va_list args)
{
    ImGuiContext& g = *GImGui;
    const int old_size = g.DebugLogBuf.size();
    if (g.ContextName[0] != 0)
        g.DebugLogBuf.appendf("[%s] [%05d] ", g.ContextName, g.FrameCount);
    else
        g.DebugLogBuf.appendf("[%05d] ", g.FrameCount);
    g.DebugLogBuf.appendfv(fmt, args);
    g.DebugLogIndex.append(g.DebugLogBuf.c_str(), old_size, g.DebugLogBuf.size());
    if (g.DebugLogFlags & ImGuiDebugLogFlags_OutputToTTY)
        IMGUI_DEBUG_PRINTF("%s", g.DebugLogBuf.begin() + old_size);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    // IMGUI_TEST_ENGINE_LOG() adds a trailing \n automatically
    const int new_size = g.DebugLogBuf.size();
    const bool trailing_carriage_return = (g.DebugLogBuf[new_size - 1] == '\n');
    if (g.DebugLogFlags & ImGuiDebugLogFlags_OutputToTestEngine)
        IMGUI_TEST_ENGINE_LOG("%.*s", new_size - old_size - (trailing_carriage_return ? 1 : 0), g.DebugLogBuf.begin() + old_size);
#endif
}